

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

iterator * __thiscall
google::sparse_hashtable<$6111fa4$>::insert_at
          (iterator *__return_storage_ptr__,sparse_hashtable<_6111fa4_> *this,const_reference obj,
          size_type pos)

{
  Table *this_00;
  bool bVar1;
  length_error *this_01;
  nonempty_iterator local_68;
  nonempty_iterator local_48;
  
  if ((this->table).settings.num_buckets - this->num_deleted < 0x222222222222222) {
    bVar1 = test_deleted(this,pos);
    if (bVar1) {
      this->num_deleted = this->num_deleted - 1;
    }
    this_00 = &this->table;
    sparsetable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
    ::set(this_00,pos,obj);
    sparsetable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
    ::get_iter(&local_48,this_00,pos);
    sparsetable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
    ::nonempty_end(&local_68,this_00);
    (__return_storage_ptr__->end).row_current._M_current = local_68.row_current._M_current;
    (__return_storage_ptr__->end).col_current = local_68.col_current;
    (__return_storage_ptr__->end).row_begin._M_current = local_68.row_begin._M_current;
    (__return_storage_ptr__->end).row_end._M_current = local_68.row_end._M_current;
    (__return_storage_ptr__->pos).row_begin._M_current = local_48.row_begin._M_current;
    (__return_storage_ptr__->pos).row_end._M_current = local_48.row_end._M_current;
    (__return_storage_ptr__->pos).row_current._M_current = local_48.row_current._M_current;
    (__return_storage_ptr__->pos).col_current = local_48.col_current;
    __return_storage_ptr__->ht = this;
    sparse_hashtable_iterator<$6111fa4$>::advance_past_deleted(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  this_01 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_01,"insert overflow");
  __cxa_throw(this_01,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

iterator insert_at(const_reference obj, size_type pos) {
    if (size() >= max_size()) {
      throw std::length_error("insert overflow");
    }
    if (test_deleted(pos)) {  // just replace if it's been deleted
      // The set() below will undelete this object.  We just worry about
      // stats
      assert(num_deleted > 0);
      --num_deleted;  // used to be, now it isn't
    }
    table.set(pos, obj);
    return iterator(this, table.get_iter(pos), table.nonempty_end());
  }